

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void re2::FactorAlternationImpl::Round2
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<re2::Splice,_std::allocator<re2::Splice>_> *splices)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Regexp *b;
  Regexp *pRVar4;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  ulong uVar6;
  Regexp *pRVar7;
  ulong uVar8;
  long lVar9;
  Regexp *prefix;
  int local_54;
  long local_50;
  vector<re2::Splice,std::allocator<re2::Splice>> *local_48;
  Regexp **local_40;
  Regexp *local_38;
  
  lVar9 = (long)nsub;
  uVar8 = 0;
  uVar6 = 0;
  pRVar4 = (Regexp *)0x0;
  local_50 = lVar9;
  local_48 = (vector<re2::Splice,std::allocator<re2::Splice>> *)splices;
  do {
    if (lVar9 < (long)uVar8) {
      return;
    }
    b = pRVar4;
    if (((long)uVar8 < lVar9) && (b = Regexp::LeadingRegexp(sub[uVar8]), pRVar4 != (Regexp *)0x0)) {
      if (8 < pRVar4->op_ - 0xc) {
        if (pRVar4->op_ == 10) {
          iVar2 = Regexp::min(pRVar4);
          iVar3 = Regexp::max(pRVar4);
          if (iVar2 == iVar3) {
            if (pRVar4->nsub_ < 2) {
              paVar5 = &pRVar4->field_5;
            }
            else {
              paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar4->field_5).submany_;
            }
            if ((paVar5->subone_->op_ < 0x15) &&
               ((0x103008U >> (paVar5->subone_->op_ & 0x1f) & 1) != 0)) goto LAB_001dd494;
          }
        }
        goto LAB_001dd4a3;
      }
LAB_001dd494:
      bVar1 = Regexp::Equal(pRVar4,b);
      pRVar7 = pRVar4;
      if (!bVar1) goto LAB_001dd4a3;
    }
    else {
LAB_001dd4a3:
      pRVar7 = b;
      iVar2 = (int)uVar6;
      if (uVar8 != iVar2 + 1 && uVar8 != uVar6) {
        local_38 = Regexp::Incref(pRVar4);
        for (lVar9 = (long)iVar2; lVar9 < (long)uVar8; lVar9 = lVar9 + 1) {
          pRVar4 = Regexp::RemoveLeadingRegexp(sub[lVar9]);
          sub[lVar9] = pRVar4;
        }
        local_40 = sub + iVar2;
        local_54 = (int)uVar8 - iVar2;
        std::vector<re2::Splice,std::allocator<re2::Splice>>::
        emplace_back<re2::Regexp*&,re2::Regexp**,int>(local_48,&local_38,&local_40,&local_54);
        lVar9 = local_50;
      }
      if ((long)uVar8 < lVar9) {
        uVar6 = uVar8 & 0xffffffff;
      }
    }
    uVar8 = uVar8 + 1;
    pRVar4 = pRVar7;
  } while( true );
}

Assistant:

void FactorAlternationImpl::Round2(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 2: Factor out common simple prefixes,
  // just the first piece of each concatenation.
  // This will be good enough a lot of the time.
  //
  // Complex subexpressions (e.g. involving quantifiers)
  // are not safe to factor because that collapses their
  // distinct paths through the automaton, which affects
  // correctness in some cases.
  int start = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // begin with first.
    Regexp* first_i = NULL;
    if (i < nsub) {
      first_i = Regexp::LeadingRegexp(sub[i]);
      if (first != NULL &&
          // first must be an empty-width op
          // OR a char class, any char or any byte
          // OR a fixed repeat of a literal, char class, any char or any byte.
          (first->op() == kRegexpBeginLine ||
           first->op() == kRegexpEndLine ||
           first->op() == kRegexpWordBoundary ||
           first->op() == kRegexpNoWordBoundary ||
           first->op() == kRegexpBeginText ||
           first->op() == kRegexpEndText ||
           first->op() == kRegexpCharClass ||
           first->op() == kRegexpAnyChar ||
           first->op() == kRegexpAnyByte ||
           (first->op() == kRegexpRepeat &&
            first->min() == first->max() &&
            (first->sub()[0]->op() == kRegexpLiteral ||
             first->sub()[0]->op() == kRegexpCharClass ||
             first->sub()[0]->op() == kRegexpAnyChar ||
             first->sub()[0]->op() == kRegexpAnyByte))) &&
          Regexp::Equal(first, first_i))
        continue;
    }

    // Found end of a run with common leading regexp:
    // sub[start:i] all begin with first,
    // but sub[i] does not.
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      Regexp* prefix = first->Incref();
      for (int j = start; j < i; j++)
        sub[j] = Regexp::RemoveLeadingRegexp(sub[j]);
      splices->emplace_back(prefix, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      first = first_i;
    }
  }
}